

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

uint64_t Imf_3_4::anon_unknown_7::writeLineOffsets
                   (OStream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  allocator<char> local_41;
  string local_40 [32];
  
  iVar2 = (*os->_vptr_OStream[3])();
  if (CONCAT44(extraout_var,iVar2) == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"Cannot determine current file position (%T).",&local_41);
    Iex_3_4::throwErrnoExc(local_40);
    std::__cxx11::string::~string(local_40);
  }
  uVar3 = 0;
  while( true ) {
    puVar1 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(lineOffsets->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= (ulong)uVar3) break;
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,puVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

uint64_t
writeLineOffsets (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const vector<uint64_t>&                  lineOffsets)
{
    uint64_t pos = os.tellp ();

    if (pos == static_cast<uint64_t> (-1))
        IEX_NAMESPACE::throwErrnoExc (
            "Cannot determine current file position (%T).");

    for (unsigned int i = 0; i < lineOffsets.size (); i++)
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, lineOffsets[i]);

    return pos;
}